

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

Functor * __thiscall Hcell::f(Functor *__return_storage_ptr__,Hcell *this)

{
  pointer pcVar1;
  
  if (this->tag == Functor) {
    (__return_storage_ptr__->id)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->id).field_2;
    pcVar1 = (this->f_).id._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->f_).id._M_string_length);
    __return_storage_ptr__->arity = (this->f_).arity;
    return __return_storage_ptr__;
  }
  __assert_fail("tag == Htag::Functor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                ,0x88,"Functor Hcell::f() const");
}

Assistant:

Functor f() const {
        assert(tag == Htag::Functor);
        return f_;
    }